

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void map2json(void)

{
  char *pcVar1;
  char primitiveMethod [12];
  map2json_t *map2jsonObj;
  char *in_stack_00000018;
  map2json_t *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  map2json_init((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  map2json_push(in_stack_00000020,in_stack_00000018,(char *)map2jsonObj);
  pcVar1 = map2json_create((map2json_t *)0x1024ad);
  printf("%s\n",pcVar1);
  map2json_destroy((map2json_t *)0x1024c8);
  return;
}

Assistant:

void map2json() {
	map2json_t *map2jsonObj = map2json_init(NULL);
	map2json_push(map2jsonObj, "test._id.$oid", "566950d1afc4a3c1d86fcdfb");
	map2json_push(map2jsonObj, "test.name", "picture");
	map2json_push(map2jsonObj, "test.file", "/var/www/html/pictureIn.png");
	map2json_push(map2jsonObj, "test.array[0].mysubobject", "value");
	map2json_push(map2jsonObj, "test.array[0].secondobject", "0");
	map2json_push(map2jsonObj, "test.array[1]", "1");
	map2json_push(map2jsonObj, "test.array[2]", "b");
	map2json_push(map2jsonObj, "test.array[3]", "3");
	map2json_push(map2jsonObj, "test.array[4]", "d");
	map2json_push(map2jsonObj, "test.array[5].object", "test");
	map2json_push(map2jsonObj, "test.array[5].object2", "test2");
	map2json_push(map2jsonObj, "test.array[x]", "6");
	map2json_push(map2jsonObj, "test.nullpointer", "null");
	map2json_push(map2jsonObj, "test.number", "1234");
	map2json_push(map2jsonObj, "test.true", "true");
	map2json_push(map2jsonObj, "test.false", "false");

	char primitiveMethod[] = " function()";
	*primitiveMethod = JSON2MAP_PRIMITIVE_PREFIXER;
	map2json_push(map2jsonObj, "test.fakePrimitive", primitiveMethod);

	printf("%s\n", map2json_create(map2jsonObj));

	map2json_destroy(map2jsonObj);
}